

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O0

void mplayer_talk(monst *mtmp)

{
  int iVar1;
  char *local_18;
  monst *mtmp_local;
  
  if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
    if ((mtmp->data == mons + urole.malenum) || (mtmp->data == mons + urole.femalenum)) {
      iVar1 = rn2(3);
      local_18 = mplayer_talk::same_class_msg[iVar1];
    }
    else {
      iVar1 = rn2(3);
      local_18 = mplayer_talk::other_class_msg[iVar1];
    }
    pline("Talk? -- %s",local_18);
  }
  return;
}

Assistant:

void mplayer_talk(struct monst *mtmp)
{
	static const char *const same_class_msg[3] = {
		"I can't win, and neither will you!",
		"You don't deserve to win!",
		"Mine should be the honor, not yours!",
	},		  *const other_class_msg[3] = {
		"The low-life wants to talk, eh?",
		"Fight, scum!",
		"Here is what I have to say!",
	};

	if (mtmp->mpeaceful) return; /* will drop to humanoid talk */

	pline("Talk? -- %s",
		(mtmp->data == &mons[urole.malenum] ||
		mtmp->data == &mons[urole.femalenum]) ?
		same_class_msg[rn2(3)] : other_class_msg[rn2(3)]);
}